

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.h
# Opt level: O0

int aom_get_qmlevel_luma_ssimulacra2(int qindex,int first,int last)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int qm_level;
  undefined4 local_10;
  
  if (in_EDI < 0x29) {
    local_10 = 10;
  }
  else if (in_EDI < 0x3d) {
    local_10 = 9;
  }
  else if (in_EDI < 0x65) {
    local_10 = 8;
  }
  else if (in_EDI < 0x79) {
    local_10 = 7;
  }
  else if (in_EDI < 0x8d) {
    local_10 = 6;
  }
  else if (in_EDI < 0xa1) {
    local_10 = 5;
  }
  else if (in_EDI < 0xc9) {
    local_10 = 4;
  }
  else if (in_EDI < 0xdd) {
    local_10 = 3;
  }
  else {
    local_10 = 2;
  }
  iVar1 = clamp(local_10,in_ESI,in_EDX);
  return iVar1;
}

Assistant:

static inline int aom_get_qmlevel_luma_ssimulacra2(int qindex, int first,
                                                   int last) {
  int qm_level = 0;

  if (qindex <= 40) {
    qm_level = 10;
  } else if (qindex <= 60) {
    qm_level = 9;
  } else if (qindex <= 100) {
    qm_level = 8;
  } else if (qindex <= 120) {
    qm_level = 7;
  } else if (qindex <= 140) {
    qm_level = 6;
  } else if (qindex <= 160) {
    qm_level = 5;
  } else if (qindex <= 200) {
    qm_level = 4;
  } else if (qindex <= 220) {
    qm_level = 3;
  } else {
    qm_level = 2;
  }

  return clamp(qm_level, first, last);
}